

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O3

void __thiscall ast::Dir_byte::~Dir_byte(Dir_byte *this)

{
  _List_node_base *p_Var1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_byte_0013c880;
  p_Var3 = (_List_node_base *)this->value_list;
  p_Var4 = p_Var3->_M_next;
  if (p_Var4 != p_Var3) {
    do {
      if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 8))();
      }
      p_Var4 = (((_List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != p_Var3);
    p_Var3 = (_List_node_base *)this->value_list;
    if (p_Var3 == (_List_node_base *)0x0) {
      p_Var3 = (_List_node_base *)0x0;
      goto LAB_0011ee59;
    }
  }
  p_Var4 = p_Var3->_M_next;
  while (p_Var4 != p_Var3) {
    p_Var1 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var1;
  }
LAB_0011ee59:
  operator_delete(p_Var3);
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013bfc8;
  pcVar2 = (this->super_Directive).super_Statement.label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_Directive).super_Statement.label.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

Dir_byte::~Dir_byte()
{
	for (auto s: *value_list)
		delete s;
	delete value_list;
}